

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

double __thiscall logging::log(logging *this,double __x)

{
  char in_AL;
  long lVar1;
  size_t sVar2;
  char *in_RDX;
  uint in_ESI;
  char *pcVar3;
  ostream *poVar4;
  double dVar5;
  va_list ap;
  char text [1024];
  undefined8 local_4f8;
  void **local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [48];
  double local_4a8;
  char local_428 [1024];
  
  if (in_AL != '\0') {
    local_4a8 = __x;
  }
  if (in_ESI == 4) {
    lVar1 = 0xc;
LAB_00124090:
    *(int *)(&this->lastrelog + lVar1) = *(int *)(&this->lastrelog + lVar1) + 1;
  }
  else if (in_ESI == 3) {
    lVar1 = 0x10;
    goto LAB_00124090;
  }
  if (4 < (int)in_ESI) {
    return __x;
  }
  if ((int)in_ESI < (int)this->minLevel) {
    return __x;
  }
  if ((int)in_ESI < 1) {
    poVar4 = (ostream *)&std::cout;
  }
  else {
    poVar4 = (ostream *)&std::cerr;
  }
  memset(local_428,0,0x3ff);
  local_4e8 = local_4d8;
  local_4f0 = &ap[0].overflow_arg_area;
  local_4f8 = 0x3000000018;
  vsnprintf(local_428,0x3ff,in_RDX,&local_4f8);
  if (this->lastrelog == true) {
    this->lastrelog = false;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (this->useColor == true) {
    if ((4 < in_ESI) || ((0x1dU >> (in_ESI & 0x1f) & 1) == 0)) goto LAB_00124197;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,&DAT_00136644 + *(int *)(&DAT_00136644 + (ulong)in_ESI * 4),7);
  }
  if (in_ESI == 3) {
    pcVar3 = "WARNING: ";
    lVar1 = 9;
  }
  else {
    if (in_ESI != 4) goto LAB_00124197;
    pcVar3 = "ERROR: ";
    lVar1 = 7;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar1);
LAB_00124197:
  sVar2 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_428,sVar2);
  if (((this->useColor == true) && (in_ESI < 5)) && (in_ESI != 1)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\x1b[0;m",5);
  }
  dVar5 = (double)std::ostream::flush();
  return dVar5;
}

Assistant:

void logging::log(loglevel level, const char* fmt, ... ) {

	// Save some statistics
	if(level == ERROR)
		cntErrors++;
	if(level == WARNING)
		cntWarnings++;


	// Check if level suffices...
	if( ! doPrint(level) )
		return;

	// Default output of log message
	std::ostream & os  = level >= INFO ? std::cerr : std::cout;

	char text[1024];
	memset(text, 0, sizeof(char)*1023);

	va_list ap;
	va_start(ap, fmt);
	vsnprintf(text, 1023, fmt, ap);
	va_end(ap);


	// Make a new line if last cmd was a relog command
	if(lastrelog)
	{
		lastrelog=false;
		os << std::endl;
	}

	// Switch color
	if( useColor )
	{
		switch( level )
		{
			case ERROR:
				os << "\033[1;31m";
				break;
			case WARNING:
				os << "\033[1;33m";
				break;
			case GOODNEWS:
				os << "\033[1;32m";
				break;
			case DEBUG:
				os << "\033[1;30m";
				break;
			default:
				break;
		}
	}


	switch( level )
	{
		case ERROR:
			os << "ERROR: ";
			break;
		case WARNING:
			os << "WARNING: ";
			break;
		default:
			break;
	}

	os << text;

	if( useColor ) {
		if( level==ERROR || level==WARNING || level==GOODNEWS || level==DEBUG )	
		os << "\033[0;m";
	}

	os.flush();
}